

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

void __thiscall irr::gui::CGUITabControl::removeTabButNotChild(CGUITabControl *this,s32 idx)

{
  u32 uVar1;
  u32 uVar2;
  u32 in_ESI;
  long in_RDI;
  array<irr::gui::IGUITab_*> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffd8;
  u32 in_stack_ffffffffffffffdc;
  undefined4 in_stack_ffffffffffffffe0;
  u32 uVar3;
  undefined4 in_stack_fffffffffffffff0;
  long lVar4;
  
  if (-1 < (int)in_ESI) {
    uVar3 = in_ESI;
    lVar4 = in_RDI;
    uVar1 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cfe17);
    uVar2 = (u32)((ulong)lVar4 >> 0x20);
    if ((int)in_ESI < (int)uVar1) {
      core::array<irr::gui::IGUITab_*>::operator[]
                ((array<irr::gui::IGUITab_*> *)CONCAT44(in_ESI,in_stack_ffffffffffffffe0),
                 in_stack_ffffffffffffffdc);
      IReferenceCounted::drop
                ((IReferenceCounted *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8))
      ;
      core::array<irr::gui::IGUITab_*>::erase(unaff_retaddr,uVar2);
      if ((int)uVar3 < *(int *)(in_RDI + 0x158)) {
        *(int *)(in_RDI + 0x158) = *(int *)(in_RDI + 0x158) + -1;
        setVisibleTab((CGUITabControl *)CONCAT44(uVar3,in_stack_fffffffffffffff0),
                      (s32)((ulong)in_RDI >> 0x20));
      }
      else if (uVar3 == *(u32 *)(in_RDI + 0x158)) {
        uVar1 = uVar3;
        uVar2 = core::array<irr::gui::IGUITab_*>::size((array<irr::gui::IGUITab_*> *)0x3cfebb);
        if (uVar3 == uVar2) {
          *(int *)(in_RDI + 0x158) = *(int *)(in_RDI + 0x158) + -1;
        }
        setVisibleTab((CGUITabControl *)CONCAT44(uVar1,in_stack_fffffffffffffff0),
                      (s32)((ulong)in_RDI >> 0x20));
      }
    }
  }
  return;
}

Assistant:

void CGUITabControl::removeTabButNotChild(s32 idx)
{
	if (idx < 0 || idx >= (s32)Tabs.size())
		return;

	Tabs[(u32)idx]->drop();
	Tabs.erase((u32)idx);

	if (idx < ActiveTabIndex) {
		--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	} else if (idx == ActiveTabIndex) {
		if ((u32)idx == Tabs.size())
			--ActiveTabIndex;
		setVisibleTab(ActiveTabIndex);
	}
}